

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_deprecated_context_flags_test(void)

{
  int iVar1;
  secp256k1_context *psVar2;
  secp256k1_context *tmp_ctx;
  int i;
  secp256k1_context *none_ctx;
  uint flags [3];
  secp256k1_context *in_stack_ffffffffffffffc8;
  secp256k1_context *in_stack_ffffffffffffffd0;
  secp256k1_context *in_stack_ffffffffffffffd8;
  uint flags_00;
  int local_1c;
  
  secp256k1_context_create((uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  local_1c = 0;
  while( true ) {
    flags_00 = (uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
    if (2 < local_1c) {
      secp256k1_context_destroy(in_stack_ffffffffffffffd0);
      return;
    }
    in_stack_ffffffffffffffd0 = (secp256k1_context *)secp256k1_context_preallocated_size(i);
    psVar2 = (secp256k1_context *)secp256k1_context_preallocated_size(i);
    if (in_stack_ffffffffffffffd0 != psVar2) break;
    in_stack_ffffffffffffffd8 = secp256k1_context_create(flags_00);
    iVar1 = context_eq(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
              ,0xa1,"test condition failed: context_eq(none_ctx, tmp_ctx)");
      abort();
    }
    secp256k1_context_destroy(in_stack_ffffffffffffffd0);
    local_1c = local_1c + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x9f,
          "test condition failed: secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE) == secp256k1_context_preallocated_size(flags[i])"
         );
  abort();
}

Assistant:

static void run_deprecated_context_flags_test(void) {
    /* Check that a context created with any of the flags in the flags array is
     * identical to the NONE context. */
    unsigned int flags[] = { SECP256K1_CONTEXT_SIGN,
                             SECP256K1_CONTEXT_VERIFY,
                             SECP256K1_CONTEXT_SIGN | SECP256K1_CONTEXT_VERIFY };
    secp256k1_context *none_ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);
    int i;
    for (i = 0; i < (int)(sizeof(flags)/sizeof(flags[0])); i++) {
        secp256k1_context *tmp_ctx;
        CHECK(secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE) == secp256k1_context_preallocated_size(flags[i]));
        tmp_ctx = secp256k1_context_create(flags[i]);
        CHECK(context_eq(none_ctx, tmp_ctx));
        secp256k1_context_destroy(tmp_ctx);
    }
    secp256k1_context_destroy(none_ctx);
}